

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O0

UStringTrieResult __thiscall
icu_63::BytesTrie::nextImpl(BytesTrie *this,uint8_t *pos,int32_t inByte)

{
  uint uVar1;
  UStringTrieResult UVar2;
  byte *pos_00;
  UStringTrieResult local_3c;
  int32_t length;
  int32_t node;
  int32_t inByte_local;
  uint8_t *pos_local;
  BytesTrie *this_local;
  
  _node = pos;
  while( true ) {
    pos_00 = _node + 1;
    uVar1 = (uint)*_node;
    if (uVar1 < 0x10) {
      UVar2 = branchNext(this,pos_00,uVar1,inByte);
      return UVar2;
    }
    if (uVar1 < 0x20) break;
    if ((*_node & 1) != 0) goto LAB_003ca75d;
    _node = skipValue(pos_00,uVar1);
  }
  if (inByte == (uint)*pos_00) {
    this->remainingMatchLength_ = uVar1 - 0x11;
    this->pos_ = _node + 2;
    if (((int)(uVar1 - 0x11) < 0) && (uVar1 = (uint)_node[2], 0x1f < uVar1)) {
      local_3c = valueResult(uVar1);
    }
    else {
      local_3c = USTRINGTRIE_NO_VALUE;
    }
    return local_3c;
  }
LAB_003ca75d:
  stop(this);
  return USTRINGTRIE_NO_MATCH;
}

Assistant:

UStringTrieResult
BytesTrie::nextImpl(const uint8_t *pos, int32_t inByte) {
    for(;;) {
        int32_t node=*pos++;
        if(node<kMinLinearMatch) {
            return branchNext(pos, node, inByte);
        } else if(node<kMinValueLead) {
            // Match the first of length+1 bytes.
            int32_t length=node-kMinLinearMatch;  // Actual match length minus 1.
            if(inByte==*pos++) {
                remainingMatchLength_=--length;
                pos_=pos;
                return (length<0 && (node=*pos)>=kMinValueLead) ?
                        valueResult(node) : USTRINGTRIE_NO_VALUE;
            } else {
                // No match.
                break;
            }
        } else if(node&kValueIsFinal) {
            // No further matching bytes.
            break;
        } else {
            // Skip intermediate value.
            pos=skipValue(pos, node);
            // The next node must not also be a value node.
            U_ASSERT(*pos<kMinValueLead);
        }
    }
    stop();
    return USTRINGTRIE_NO_MATCH;
}